

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  long lVar6;
  
  if (this != other) {
    clear(this);
    reserve(this,other->nStored);
    if (other->nStored == 0) {
      uVar3 = 0;
    }
    else {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pbVar2 = this->ptr;
        if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->field_2;
        }
        pbVar4 = other->ptr;
        if (other->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &other->field_2;
        }
        *(char **)((pbVar2->field_2)._M_local_buf + lVar6 + -0x10) =
             (pbVar2->field_2)._M_local_buf + lVar6;
        lVar1 = *(long *)((long)&pbVar4->_M_dataplus + lVar6);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&pbVar2->_M_dataplus + lVar6),lVar1,
                   *(long *)((long)&pbVar4->_M_string_length + lVar6) + lVar1);
        uVar3 = other->nStored;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x20;
      } while (uVar5 < uVar3);
    }
    this->nStored = uVar3;
  }
  return this;
}

Assistant:

InlinedVector &operator=(const InlinedVector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(begin() + i, other[i]);
        nStored = other.size();

        return *this;
    }